

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O0

void anon_unknown.dwarf_1d741c::readPixels
               (char *pFilename,int pNbChannels,Array2D<Imath_3_2::half> *pPixels)

{
  Slice *pSVar1;
  byte bVar2;
  int iVar3;
  half *phVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  _Base_ptr in_RDX;
  int in_ESI;
  char *in_RDI;
  float fVar8;
  bool is_optimized;
  int i;
  FrameBuffer lInputFrameBuffer;
  int lWidth;
  Box2i lDataWindow;
  InputFile lFile;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  Slice local_c8 [60];
  int local_8c;
  char local_88 [48];
  int local_58;
  int local_48;
  int local_44;
  int local_40;
  FrameBuffer local_38;
  
  local_38._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = in_RDX;
  local_38._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = in_ESI;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&local_38,in_RDI,iVar3);
  Imf_3_4::InputFile::header();
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_58 = (local_40 - local_48) + 1;
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1e2b62);
  for (local_8c = 0; local_8c < local_38._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
      ; local_8c = local_8c + 1) {
    pSVar1 = *(Slice **)((anonymous_namespace)::CHANNEL_NAMES + (long)local_8c * 8);
    phVar4 = Imf_3_4::Array2D<Imath_3_2::half>::operator[]
                       ((Array2D<Imath_3_2::half> *)
                        local_38._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right,0);
    lVar6 = (long)local_8c;
    lVar5 = (long)local_38._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    lVar7 = (long)local_58;
    fVar8 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    in_stack_fffffffffffffed0 = 0;
    Imf_3_4::Slice::Slice
              (local_c8,HALF,(char *)(phVar4 + lVar6),lVar5 * 2,lVar5 * 2 * lVar7,1,1,(double)fVar8,
               false,false);
    Imf_3_4::FrameBuffer::insert(local_88,pSVar1);
  }
  Imf_3_4::InputFile::setFrameBuffer(&local_38);
  bVar2 = Imf_3_4::InputFile::isOptimizationEnabled();
  if ((bVar2 & 1) == 0) {
    std::operator<<((ostream *)&std::cout," optimization disabled\n");
  }
  else {
    std::operator<<((ostream *)&std::cout," optimization enabled\n");
    if ((local_38._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 2) &&
       (std::operator<<((ostream *)&std::cerr,
                        " error: isOptimizationEnabled returned TRUE, but optimization not known to work for two channel images\n"
                       ), local_38._map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 2)
       ) {
      __assert_fail("pNbChannels != 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testOptimized.cpp"
                    ,0x14a,
                    "void (anonymous namespace)::readPixels(const char *, int, Array2D<half> &)");
    }
  }
  Imf_3_4::InputFile::readPixels((int)&local_38,local_44);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1e2d76);
  Imf_3_4::InputFile::~InputFile
            ((InputFile *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  return;
}

Assistant:

void
readPixels (const char pFilename[], int pNbChannels, Array2D<half>& pPixels)
{
    InputFile    lFile (pFilename);
    IMATH::Box2i lDataWindow = lFile.header ().dataWindow ();

    int lWidth = lDataWindow.max.x - lDataWindow.min.x + 1;

    FrameBuffer lInputFrameBuffer;

    for (int i = 0; i < pNbChannels; ++i)
    {
        lInputFrameBuffer.insert (
            CHANNEL_NAMES[i],
            Slice (
                HALF,
                (char*) &pPixels[0][i],
                sizeof (pPixels[0][0]) * pNbChannels,
                sizeof (pPixels[0][0]) * pNbChannels * lWidth,
                1,
                1,
                ALPHA_DEFAULT_VALUE));
    }

    lFile.setFrameBuffer (lInputFrameBuffer);

    bool is_optimized = lFile.isOptimizationEnabled ();
    if (is_optimized)
    {
        cout << " optimization enabled\n";

        if (pNbChannels == 2)
        {
            cerr << " error: isOptimizationEnabled returned TRUE, but "
                    "optimization not known to work for two channel images\n";
            assert (pNbChannels != 2);
        }
    }
    else
    {
        cout << " optimization disabled\n";
#ifdef IMF_HAVE_SSE2
        if (pNbChannels != 2)
        {
            cerr << " error: isOptimizationEnabled returned FALSE, but "
                    "should work for "
                 << pNbChannels << "channel images\n";
            assert (pNbChannels == 2);
        }

#endif
    }

    lFile.readPixels (lDataWindow.min.y, lDataWindow.max.y);
}